

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usd-export.cc
# Opt level: O0

bool tinyusdz::tydra::detail::ExportSkelAnimation(Animation *anim,SkelAnimation *dst,string *err)

{
  value_type_conflict vVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  undefined1 auVar8 [8];
  bool bVar9;
  bool bVar10;
  half hVar11;
  long lVar12;
  PrimMeta *pPVar13;
  size_type sVar14;
  reference key;
  size_t sVar15;
  size_type sVar16;
  ostream *poVar17;
  mapped_type *this;
  reference pvVar18;
  reference ppVar19;
  const_reference pvVar20;
  mapped_type *pmVar21;
  const_reference pvVar22;
  float *pfVar23;
  reference pvVar24;
  value_type *pvVar25;
  pointer ppVar26;
  pointer ppVar27;
  const_reference pvVar28;
  mapped_type *pmVar29;
  const_reference pvVar30;
  reference pvVar31;
  reference pvVar32;
  value_type *pvVar33;
  size_type sVar34;
  reference key_00;
  reference pvVar35;
  pointer ppVar36;
  size_type sVar37;
  const_reference pvVar38;
  reference puVar39;
  mapped_type *this_00;
  size_type sVar40;
  uint64_t uVar41;
  reference pvVar42;
  value_type_conflict *pvVar43;
  size_type sVar44;
  reference ppVar45;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  float fVar46;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar47;
  pair<const_double,_std::vector<float,_std::allocator<float>_>_> *s_3;
  iterator __end3_7;
  iterator __begin3_7;
  map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
  *__range3_7;
  Animatable<std::vector<float,_std::allocator<float>_>_> aval_3;
  uint64_t target_id_2;
  vector<float,_std::allocator<float>_> *local_1a80;
  vector<float,_std::allocator<float>_> *weights;
  uint64_t local_1a58;
  uint64_t target_id_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a30;
  allocator local_1a09;
  string local_1a08 [32];
  string local_19e8;
  ostringstream local_19c8 [8];
  ostringstream ss_e_7;
  uint32_t local_1850;
  float local_184c;
  ulong uStack_1848;
  float tc_7;
  size_t t_7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>
  *target_2;
  const_iterator __end3_6;
  const_iterator __begin3_6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
  *__range3_6;
  vector<float,_std::allocator<float>_> static_weights;
  uint *tc_6;
  iterator __end3_5;
  iterator __begin3_5;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range3_5;
  map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
  ts_weights;
  uint32_t local_179c;
  ulong local_1798;
  size_t t_6;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>
  *local_1788;
  const_iterator *weights_it;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  timeCodes_3;
  Token local_1728;
  reference local_1708;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>
  *target_1;
  const_iterator __end3_4;
  const_iterator __begin3_4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
  *__range3_4;
  undefined1 local_16e0 [8];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> blendShapes;
  uint64_t target_id;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>
  *target;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
  *__range3_3;
  StringAndIdMap target_idMap;
  pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
  *s_2;
  iterator __end4_8;
  iterator __begin4_8;
  map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
  *__range4_8;
  Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
  aval_2;
  array<tinyusdz::value::half,_3UL> local_15d6;
  undefined1 local_15d0 [2];
  half3 v_3;
  uint64_t joint_id_6;
  array<tinyusdz::value::half,_3UL> local_159e;
  double dStack_1598;
  half3 v_2;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  *scales_1;
  uint64_t local_1568;
  uint64_t joint_id_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1540;
  allocator local_1519;
  string local_1518 [32];
  string local_14f8;
  ostringstream local_14d8 [8];
  ostringstream ss_e_6;
  uint32_t local_1360;
  float local_135c;
  ulong uStack_1358;
  float tc_5;
  size_t t_5;
  key_type local_1344;
  _Self local_1340;
  _Self *local_1338;
  const_iterator *scale_it_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>
  *channels_5;
  const_iterator __end4_7;
  const_iterator __begin4_7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
  *__range4_7;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  static_scales;
  uint *tc_4;
  iterator __end4_6;
  iterator __begin4_6;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range4_6;
  map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
  ts_scales;
  uint32_t local_128c;
  ulong local_1288;
  size_t t_4;
  _Self local_1278;
  key_type local_126c;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
  local_1268;
  _Self local_1260;
  _Self *local_1258;
  const_iterator *scale_it;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  timeCodes_2;
  value_type local_11d6;
  undefined1 local_11d0 [8];
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  scales;
  pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
  *s_1;
  iterator __end4_5;
  iterator __begin4_5;
  map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
  *__range4_5;
  Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_> aval_1;
  quatf v_1;
  uint64_t joint_id_4;
  quatf v;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *rots_1;
  uint64_t local_10e0;
  uint64_t joint_id_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b8;
  allocator local_1091;
  string local_1090 [32];
  string local_1070;
  ostringstream local_1050 [8];
  ostringstream ss_e_5;
  uint32_t local_ed8;
  float local_ed4;
  ulong uStack_ed0;
  float tc_3;
  size_t t_3;
  key_type local_ebc;
  _Self local_eb8;
  _Self *local_eb0;
  const_iterator *rot_it_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>
  *channels_4;
  const_iterator __end4_4;
  const_iterator __begin4_4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
  *__range4_4;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> static_rots;
  uint *tc_2;
  iterator __end4_3;
  iterator __begin4_3;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range4_3;
  map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
  ts_rots;
  uint32_t local_e04;
  ulong local_e00;
  size_t t_2;
  _Self local_df0;
  key_type local_de4;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
  local_de0;
  _Self local_dd8;
  _Self *local_dd0;
  const_iterator *rot_it;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  timeCodes_1;
  undefined1 local_d40 [8];
  quatf q;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> rots;
  pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  *s;
  iterator __end4_2;
  iterator __begin4_2;
  map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
  *__range4_2;
  Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_> aval;
  uint64_t joint_id_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70;
  size_type local_c50;
  allocator local_c41;
  string local_c40 [32];
  string local_c20;
  ostringstream local_c00 [8];
  ostringstream ss_e_4;
  double local_a88;
  mapped_type *local_a80;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *txs;
  undefined1 local_a58 [8];
  uint64_t joint_id_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  allocator local_a09;
  string local_a08 [32];
  string local_9e8;
  ostringstream local_9c8 [8];
  ostringstream ss_e_3;
  uint32_t local_850;
  float local_84c;
  ulong uStack_848;
  float tc_1;
  size_t t_1;
  key_type local_834;
  _Self local_830;
  _Self *local_828;
  const_iterator *tx_it_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>
  *channels_3;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
  *__range4_1;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> static_txs;
  uint *tc;
  iterator __end4;
  iterator __begin4;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range4;
  map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
  ts_txs;
  uint32_t local_77c;
  ulong local_778;
  size_t t;
  _Self local_768;
  key_type local_75c;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
  local_758;
  _Self local_750;
  _Self *local_748;
  const_iterator *tx_it;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  timeCodes;
  value_type local_6c4;
  undefined1 local_6b8 [8];
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> translations;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  ostringstream local_660 [8];
  ostringstream ss_e_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  ostringstream local_4a8 [8];
  ostringstream ss_e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  ostringstream local_2e8 [8];
  ostringstream ss_e;
  key_type local_170 [3];
  undefined1 local_163;
  byte local_162;
  byte local_161;
  bool has_scale_channel;
  bool has_rot_channel;
  reference ppStack_160;
  bool has_tx_channel;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>
  *channels_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
  *__range3_2;
  undefined1 local_138 [2];
  bool all_joints_has_scale_channel;
  bool all_joints_has_rot_channel;
  bool all_joints_has_tx_channel;
  bool no_scale_channel;
  bool no_rot_channel;
  bool no_tx_channel;
  Token local_118;
  reference local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>
  *channels_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
  *__range3_1;
  undefined1 local_d0 [8];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> joints;
  uint64_t joint_id;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>
  *channels;
  const_iterator __end3;
  const_iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
  *__range3;
  StringAndIdMap joint_idMap;
  anon_class_1_0_00000001 float_to_double;
  anon_class_1_0_00000001 uint_to_float;
  anon_class_1_0_00000001 float_to_uint;
  string *err_local;
  SkelAnimation *dst_local;
  Animation *anim_local;
  
  ::std::__cxx11::string::operator=((string *)dst,(string *)anim);
  lVar12 = ::std::__cxx11::string::size();
  if (lVar12 != 0) {
    pPVar13 = SkelAnimation::metas(dst);
    nonstd::optional_lite::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&pPVar13->displayName,&anim->display_name);
  }
  sVar14 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
           ::size(&anim->channels_map);
  if (sVar14 != 0) {
    StringAndIdMap::StringAndIdMap((StringAndIdMap *)&__range3);
    __end3 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
             ::begin(&anim->channels_map);
    channels = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>
                *)::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                  ::end(&anim->channels_map);
    while (bVar9 = ::std::operator!=(&__end3,(_Self *)&channels), bVar9) {
      key = ::std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
            ::operator*(&__end3);
      joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)StringAndIdMap::size((StringAndIdMap *)&__range3);
      StringAndIdMap::add((StringAndIdMap *)&__range3,&key->first,
                          (uint64_t)
                          joints.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
      ::operator++(&__end3);
    }
    sVar15 = StringAndIdMap::size((StringAndIdMap *)&__range3);
    ::std::allocator<tinyusdz::Token>::allocator
              ((allocator<tinyusdz::Token> *)((long)&__range3_1 + 7));
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_d0,sVar15,
               (allocator_type *)((long)&__range3_1 + 7));
    ::std::allocator<tinyusdz::Token>::~allocator
              ((allocator<tinyusdz::Token> *)((long)&__range3_1 + 7));
    __end3_1 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
               ::begin(&anim->channels_map);
    channels_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>
                  *)::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                    ::end(&anim->channels_map);
    while (bVar9 = ::std::operator!=(&__end3_1,(_Self *)&channels_1), bVar9) {
      local_f8 = ::std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
                 ::operator*(&__end3_1);
      Token::Token(&local_118,&local_f8->first);
      ::std::__cxx11::string::string((string *)local_138,(string *)local_f8);
      uVar41 = StringAndIdMap::at((StringAndIdMap *)&__range3,(string *)local_138);
      pvVar35 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                          ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_d0,
                           uVar41);
      Token::operator=(pvVar35,&local_118);
      ::std::__cxx11::string::~string((string *)local_138);
      Token::~Token(&local_118);
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
      ::operator++(&__end3_1);
    }
    TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::operator=
              (&dst->joints,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_d0);
    bVar9 = true;
    bVar3 = true;
    bVar5 = true;
    bVar2 = true;
    bVar4 = true;
    bVar6 = true;
    __end3_2 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
               ::begin(&anim->channels_map);
    channels_2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>
                  *)::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                    ::end(&anim->channels_map);
    while (bVar10 = ::std::operator!=(&__end3_2,(_Self *)&channels_2), bVar10) {
      ppStack_160 = ::std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
                    ::operator*(&__end3_2);
      local_170[2] = 1;
      sVar16 = ::std::
               map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
               ::count(&ppStack_160->second,local_170 + 2);
      local_161 = sVar16 != 0;
      local_170[1] = 2;
      sVar16 = ::std::
               map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
               ::count(&ppStack_160->second,local_170 + 1);
      local_162 = sVar16 != 0;
      local_170[0] = Scale;
      sVar16 = ::std::
               map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
               ::count(&ppStack_160->second,local_170);
      local_163 = sVar16 != 0;
      if ((local_161 & 1) == 0) {
        bVar2 = false;
      }
      else {
        bVar9 = false;
      }
      if ((local_162 & 1) == 0) {
        bVar4 = false;
      }
      else {
        bVar3 = false;
      }
      if ((bool)local_163) {
        bVar5 = false;
      }
      else {
        bVar6 = false;
      }
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
      ::operator++(&__end3_2);
    }
    if ((bVar9) || (bVar2)) {
      if ((bVar3) || (bVar4)) {
        if ((bVar5) || (bVar6)) {
          if (bVar9) {
            ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                      ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       local_6b8);
            sVar37 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                               ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                local_d0);
            local_6c4._M_elems[0] = 1.0;
            local_6c4._M_elems[1] = 1.0;
            local_6c4._M_elems[2] = 1.0;
            ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::assign
                      ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       local_6b8,sVar37,&local_6c4);
            Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
            ::Animatable((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                          *)&timeCodes._M_h._M_single_bucket,
                         (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *
                         )local_6b8);
            TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
            ::set_value(&dst->translations,
                        (Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                         *)&timeCodes._M_h._M_single_bucket);
            Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
            ::~Animatable((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                           *)&timeCodes._M_h._M_single_bucket);
            ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
                      ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       local_6b8);
          }
          else {
            ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&tx_it);
            local_758._M_node =
                 (_Base_ptr)
                 ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                 ::cbegin(&anim->channels_map);
            ppVar26 = ::std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
                      ::operator->(&local_758);
            local_75c = Translation;
            local_750._M_node =
                 (_Base_ptr)
                 ::std::
                 map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                 ::find(&ppVar26->second,&local_75c);
            local_748 = &local_750;
            t = (size_t)::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                        ::cbegin(&anim->channels_map);
            ppVar26 = ::std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
                      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
                                    *)&t);
            local_768._M_node =
                 (_Base_ptr)
                 ::std::
                 map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                 ::end(&ppVar26->second);
            bVar9 = ::std::operator!=(&local_750,&local_768);
            if (bVar9) {
              local_778 = 0;
              while( true ) {
                uVar7 = local_778;
                ppVar27 = ::std::
                          _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                          ::operator->(local_748);
                sVar37 = ::std::
                         vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                         ::size(&(ppVar27->second).translations.samples);
                if (sVar37 <= uVar7) break;
                ppVar27 = ::std::
                          _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                          ::operator->(local_748);
                pvVar28 = ::std::
                          vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                          ::operator[](&(ppVar27->second).translations.samples,local_778);
                local_77c = ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                      ((anon_class_1_0_00000001 *)
                                       ((long)&joint_idMap._s_to_i._M_t._M_impl.
                                               super__Rb_tree_header._M_node_count + 7),pvVar28->t);
                pVar47 = ::std::
                         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)&tx_it,&local_77c);
                ts_txs._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     (size_t)pVar47.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
                local_778 = local_778 + 1;
              }
            }
            ::std::
            map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
            ::map((map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                   *)&__range4);
            __end4 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&tx_it);
            tc = (uint *)::std::
                         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)&tx_it);
            while (bVar9 = ::std::__detail::operator!=
                                     (&__end4.super__Node_iterator_base<unsigned_int,_false>,
                                      (_Node_iterator_base<unsigned_int,_false> *)&tc), bVar9) {
              puVar39 = ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*
                                  (&__end4);
              fVar46 = ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                 ((anon_class_1_0_00000001 *)
                                  ((long)&joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count + 6),*puVar39);
              static_txs.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                      ((anon_class_1_0_00000001 *)
                                       ((long)&joint_idMap._s_to_i._M_t._M_impl.
                                               super__Rb_tree_header._M_node_count + 5),fVar46);
              this = ::std::
                     map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                     ::operator[]((map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                                   *)&__range4,
                                  (key_type_conflict3 *)
                                  &static_txs.
                                   super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
              sVar37 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                 ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                  local_d0);
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              resize(this,sVar37);
              ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end4);
            }
            ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                      ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &__range4_1);
            __end4_1 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                       ::begin(&anim->channels_map);
            channels_3 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>
                          *)::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                            ::end(&anim->channels_map);
            while (bVar9 = ::std::operator!=(&__end4_1,(_Self *)&channels_3), bVar9) {
              tx_it_1 = (const_iterator *)
                        ::std::
                        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
                        ::operator*(&__end4_1);
              local_834 = Translation;
              local_830._M_node =
                   (_Base_ptr)
                   ::std::
                   map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                   ::find(&((reference)tx_it_1)->second,&local_834);
              local_828 = &local_830;
              t_1 = (size_t)::std::
                            map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                            ::end((map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                                   *)(tx_it_1 + 4));
              bVar9 = ::std::operator!=(&local_830,(_Self *)&t_1);
              if (bVar9) {
                uStack_848 = 0;
                while( true ) {
                  uVar7 = uStack_848;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_828);
                  sVar37 = ::std::
                           vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                           ::size(&(ppVar27->second).translations.samples);
                  if (sVar37 <= uVar7) break;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_828);
                  pvVar28 = ::std::
                            vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                            ::operator[](&(ppVar27->second).translations.samples,uStack_848);
                  local_84c = pvVar28->t;
                  local_850 = ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                        ((anon_class_1_0_00000001 *)
                                         ((long)&joint_idMap._s_to_i._M_t._M_impl.
                                                 super__Rb_tree_header._M_node_count + 7),local_84c)
                  ;
                  sVar40 = ::std::
                           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                    *)&tx_it,&local_850);
                  if (sVar40 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream(local_9c8);
                    poVar17 = ::std::operator<<((ostream *)local_9c8,"[error]");
                    poVar17 = ::std::operator<<(poVar17,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                               );
                    poVar17 = ::std::operator<<(poVar17,":");
                    poVar17 = ::std::operator<<(poVar17,"ExportSkelAnimation");
                    poVar17 = ::std::operator<<(poVar17,"():");
                    poVar17 = (ostream *)::std::ostream::operator<<(poVar17,0x127);
                    ::std::operator<<(poVar17," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_a08,
                               "All animation channels should have same timeCodes. timeCode {} is only seen in `translation` animation channel of joint {}"
                               ,&local_a09);
                    fmt::format<float,std::__cxx11::string>
                              (&local_9e8,(fmt *)local_a08,(string *)&local_84c,(float *)tx_it_1,
                               in_R8);
                    poVar17 = ::std::operator<<((ostream *)local_9c8,(string *)&local_9e8);
                    ::std::operator<<(poVar17,"\n");
                    ::std::__cxx11::string::~string((string *)&local_9e8);
                    ::std::__cxx11::string::~string(local_a08);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_a09);
                    if (err != (string *)0x0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::operator+(&local_a30,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&joint_id_1,"\n");
                      ::std::__cxx11::string::operator+=((string *)err,(string *)&local_a30);
                      ::std::__cxx11::string::~string((string *)&local_a30);
                      ::std::__cxx11::string::~string((string *)&joint_id_1);
                    }
                    anim_local._7_1_ = 0;
                    bVar9 = true;
                    ::std::__cxx11::ostringstream::~ostringstream(local_9c8);
                    goto LAB_0048c01c;
                  }
                  ::std::__cxx11::string::string((string *)&txs,(string *)tx_it_1);
                  uVar41 = StringAndIdMap::at((StringAndIdMap *)&__range3,(string *)&txs);
                  ::std::__cxx11::string::~string((string *)&txs);
                  local_a58 = (undefined1  [8])uVar41;
                  local_a88 = ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                        ((anon_class_1_0_00000001 *)
                                         ((long)&joint_idMap._s_to_i._M_t._M_impl.
                                                 super__Rb_tree_header._M_node_count + 5),local_84c)
                  ;
                  local_a80 = ::std::
                              map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                              ::at((map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                                    *)&__range4,&local_a88);
                  auVar8 = local_a58;
                  sVar37 = ::std::
                           vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           ::size(local_a80);
                  if (sVar37 < (ulong)auVar8) {
                    ::std::__cxx11::ostringstream::ostringstream(local_c00);
                    poVar17 = ::std::operator<<((ostream *)local_c00,"[error]");
                    poVar17 = ::std::operator<<(poVar17,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                               );
                    poVar17 = ::std::operator<<(poVar17,":");
                    poVar17 = ::std::operator<<(poVar17,"ExportSkelAnimation");
                    poVar17 = ::std::operator<<(poVar17,"():");
                    poVar17 = (ostream *)::std::ostream::operator<<(poVar17,0x12e);
                    ::std::operator<<(poVar17," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_c40,"Internal error. joint_id {} exceeds # of joints {}",
                               &local_c41);
                    local_c50 = ::std::
                                vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                ::size(local_a80);
                    fmt::format<unsigned_long,unsigned_long>
                              (&local_c20,(fmt *)local_c40,(string *)local_a58,&local_c50,
                               (unsigned_long *)in_R8);
                    poVar17 = ::std::operator<<((ostream *)local_c00,(string *)&local_c20);
                    ::std::operator<<(poVar17,"\n");
                    ::std::__cxx11::string::~string((string *)&local_c20);
                    ::std::__cxx11::string::~string(local_c40);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_c41);
                    if (err != (string *)0x0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::operator+(&local_c70,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&joint_id_2,"\n");
                      ::std::__cxx11::string::operator+=((string *)err,(string *)&local_c70);
                      ::std::__cxx11::string::~string((string *)&local_c70);
                      ::std::__cxx11::string::~string((string *)&joint_id_2);
                    }
                    anim_local._7_1_ = 0;
                    bVar9 = true;
                    ::std::__cxx11::ostringstream::~ostringstream(local_c00);
                    goto LAB_0048c01c;
                  }
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_828);
                  pvVar28 = ::std::
                            vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                            ::operator[](&(ppVar27->second).translations.samples,uStack_848);
                  pvVar18 = ::std::
                            vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            ::operator[](local_a80,(size_type)local_a58);
                  *(undefined8 *)pvVar18->_M_elems = *(undefined8 *)(pvVar28->value)._M_elems;
                  pvVar18->_M_elems[2] = (pvVar28->value)._M_elems[2];
                  uStack_848 = uStack_848 + 1;
                }
                ppVar27 = ::std::
                          _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                          ::operator->(local_828);
                bVar9 = nonstd::optional_lite::optional::operator_cast_to_bool
                                  ((optional *)&(ppVar27->second).translations);
                if (bVar9) {
                  ::std::__cxx11::string::string((string *)&aval._ts._dirty,(string *)tx_it_1);
                  uVar41 = StringAndIdMap::at((StringAndIdMap *)&__range3,(string *)&aval._ts._dirty
                                             );
                  ::std::__cxx11::string::~string((string *)&aval._ts._dirty);
                  sVar37 = ::std::
                           vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           ::size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                   *)&__range4_1);
                  if (sVar37 < uVar41 + 1) {
                    ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ::resize((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              *)&__range4_1,uVar41 + 1);
                  }
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_828);
                  pvVar33 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                                      (&(ppVar27->second).translations.static_value);
                  pvVar18 = ::std::
                            vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            ::operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                          *)&__range4_1,uVar41);
                  *(undefined8 *)pvVar18->_M_elems = *(undefined8 *)pvVar33->_M_elems;
                  pvVar18->_M_elems[2] = pvVar33->_M_elems[2];
                }
              }
              ::std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
              ::operator++(&__end4_1);
            }
            Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
            ::Animatable((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                          *)&__range4_2);
            sVar37 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ::size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             *)&__range4_1);
            sVar44 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                               ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                local_d0);
            if (sVar37 == sVar44) {
              Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
              ::set_default((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                             *)&__range4_2,
                            (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             *)&__range4_1);
            }
            __end4_2 = ::std::
                       map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                       ::begin((map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                                *)&__range4);
            s = (pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                 *)::std::
                   map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                   ::end((map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                          *)&__range4);
            while (bVar9 = ::std::operator!=(&__end4_2,(_Self *)&s), bVar9) {
              ppVar19 = ::std::
                        _Rb_tree_iterator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                        ::operator*(&__end4_2);
              Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
              ::add_sample((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                            *)&__range4_2,ppVar19->first,&ppVar19->second);
              ::std::
              _Rb_tree_iterator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
              ::operator++(&__end4_2);
            }
            TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
            ::set_value(&dst->translations,
                        (Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                         *)&__range4_2);
            Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
            ::~Animatable((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                           *)&__range4_2);
            bVar9 = false;
LAB_0048c01c:
            ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
                      ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &__range4_1);
            ::std::
            map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
            ::~map((map<double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>_>
                    *)&__range4);
            ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&tx_it);
            if (bVar9) goto LAB_0048d7dd;
          }
          if (bVar3) {
            ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::vector
                      ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                       (q.imag._M_elems + 2));
            local_d40._0_4_ = 0.0;
            local_d40._4_4_ = 0.0;
            q.imag._M_elems[0] = 0.0;
            q.imag._M_elems[1] = 1.0;
            sVar37 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                               ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                local_d0);
            ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::assign
                      ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                       (q.imag._M_elems + 2),sVar37,(value_type *)local_d40);
            Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
            ::Animatable((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                          *)&timeCodes_1._M_h._M_single_bucket,
                         (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                         (q.imag._M_elems + 2));
            TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
            ::set_value(&dst->rotations,
                        (Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                         *)&timeCodes_1._M_h._M_single_bucket);
            Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
            ::~Animatable((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                           *)&timeCodes_1._M_h._M_single_bucket);
            ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::~vector
                      ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                       (q.imag._M_elems + 2));
          }
          else {
            ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&rot_it);
            local_de0._M_node =
                 (_Base_ptr)
                 ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                 ::cbegin(&anim->channels_map);
            ppVar26 = ::std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
                      ::operator->(&local_de0);
            local_de4 = Rotation;
            local_dd8._M_node =
                 (_Base_ptr)
                 ::std::
                 map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                 ::find(&ppVar26->second,&local_de4);
            local_dd0 = &local_dd8;
            t_2 = (size_t)::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                          ::cbegin(&anim->channels_map);
            ppVar26 = ::std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
                      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
                                    *)&t_2);
            local_df0._M_node =
                 (_Base_ptr)
                 ::std::
                 map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                 ::end(&ppVar26->second);
            bVar9 = ::std::operator!=(&local_dd8,&local_df0);
            if (bVar9) {
              local_e00 = 0;
              while( true ) {
                uVar7 = local_e00;
                ppVar27 = ::std::
                          _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                          ::operator->(local_dd0);
                sVar37 = ::std::
                         vector<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                         ::size(&(ppVar27->second).rotations.samples);
                if (sVar37 <= uVar7) break;
                ppVar27 = ::std::
                          _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                          ::operator->(local_dd0);
                pvVar20 = ::std::
                          vector<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                          ::operator[](&(ppVar27->second).rotations.samples,local_e00);
                local_e04 = ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                      ((anon_class_1_0_00000001 *)
                                       ((long)&joint_idMap._s_to_i._M_t._M_impl.
                                               super__Rb_tree_header._M_node_count + 7),pvVar20->t);
                pVar47 = ::std::
                         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)&rot_it,&local_e04);
                ts_rots._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     (size_t)pVar47.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
                local_e00 = local_e00 + 1;
              }
            }
            ::std::
            map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
            ::map((map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                   *)&__range4_3);
            __end4_3 = ::std::
                       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)&rot_it);
            tc_2 = (uint *)::std::
                           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)&rot_it);
            while (bVar9 = ::std::__detail::operator!=
                                     (&__end4_3.super__Node_iterator_base<unsigned_int,_false>,
                                      (_Node_iterator_base<unsigned_int,_false> *)&tc_2), bVar9) {
              puVar39 = ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*
                                  (&__end4_3);
              fVar46 = ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                 ((anon_class_1_0_00000001 *)
                                  ((long)&joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count + 6),*puVar39);
              static_rots.
              super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                      ((anon_class_1_0_00000001 *)
                                       ((long)&joint_idMap._s_to_i._M_t._M_impl.
                                               super__Rb_tree_header._M_node_count + 5),fVar46);
              pmVar21 = ::std::
                        map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                        ::operator[]((map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                                      *)&__range4_3,
                                     (key_type_conflict3 *)
                                     &static_rots.
                                      super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              sVar37 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                 ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                  local_d0);
              ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::resize
                        (pmVar21,sVar37);
              ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end4_3);
            }
            ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::vector
                      ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                       &__range4_4);
            __end4_4 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                       ::begin(&anim->channels_map);
            channels_4 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>
                          *)::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                            ::end(&anim->channels_map);
            while (bVar9 = ::std::operator!=(&__end4_4,(_Self *)&channels_4), bVar9) {
              rot_it_1 = (const_iterator *)
                         ::std::
                         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
                         ::operator*(&__end4_4);
              local_ebc = Rotation;
              local_eb8._M_node =
                   (_Base_ptr)
                   ::std::
                   map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                   ::find(&((reference)rot_it_1)->second,&local_ebc);
              local_eb0 = &local_eb8;
              t_3 = (size_t)::std::
                            map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                            ::end((map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                                   *)(rot_it_1 + 4));
              bVar9 = ::std::operator!=(&local_eb8,(_Self *)&t_3);
              if (bVar9) {
                uStack_ed0 = 0;
                while( true ) {
                  uVar7 = uStack_ed0;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_eb0);
                  sVar37 = ::std::
                           vector<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                           ::size(&(ppVar27->second).rotations.samples);
                  if (sVar37 <= uVar7) break;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_eb0);
                  pvVar20 = ::std::
                            vector<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                            ::operator[](&(ppVar27->second).rotations.samples,uStack_ed0);
                  local_ed4 = pvVar20->t;
                  local_ed8 = ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                        ((anon_class_1_0_00000001 *)
                                         ((long)&joint_idMap._s_to_i._M_t._M_impl.
                                                 super__Rb_tree_header._M_node_count + 7),local_ed4)
                  ;
                  sVar40 = ::std::
                           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                    *)&rot_it,&local_ed8);
                  if (sVar40 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream(local_1050);
                    poVar17 = ::std::operator<<((ostream *)local_1050,"[error]");
                    poVar17 = ::std::operator<<(poVar17,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                               );
                    poVar17 = ::std::operator<<(poVar17,":");
                    poVar17 = ::std::operator<<(poVar17,"ExportSkelAnimation");
                    poVar17 = ::std::operator<<(poVar17,"():");
                    poVar17 = (ostream *)::std::ostream::operator<<(poVar17,0x171);
                    ::std::operator<<(poVar17," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_1090,
                               "All animation channels should have same timeCodes. timeCode {} is only seen in `rotation` animation channel of joint {}"
                               ,&local_1091);
                    fmt::format<float,std::__cxx11::string>
                              (&local_1070,(fmt *)local_1090,(string *)&local_ed4,(float *)rot_it_1,
                               in_R8);
                    poVar17 = ::std::operator<<((ostream *)local_1050,(string *)&local_1070);
                    ::std::operator<<(poVar17,"\n");
                    ::std::__cxx11::string::~string((string *)&local_1070);
                    ::std::__cxx11::string::~string(local_1090);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_1091);
                    if (err != (string *)0x0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::operator+(&local_10b8,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&joint_id_3,"\n");
                      ::std::__cxx11::string::operator+=((string *)err,(string *)&local_10b8);
                      ::std::__cxx11::string::~string((string *)&local_10b8);
                      ::std::__cxx11::string::~string((string *)&joint_id_3);
                    }
                    anim_local._7_1_ = 0;
                    bVar9 = true;
                    ::std::__cxx11::ostringstream::~ostringstream(local_1050);
                    goto LAB_0048cc39;
                  }
                  ::std::__cxx11::string::string((string *)&rots_1,(string *)rot_it_1);
                  uVar41 = StringAndIdMap::at((StringAndIdMap *)&__range3,(string *)&rots_1);
                  ::std::__cxx11::string::~string((string *)&rots_1);
                  local_10e0 = uVar41;
                  v._8_8_ = ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                      ((anon_class_1_0_00000001 *)
                                       ((long)&joint_idMap._s_to_i._M_t._M_impl.
                                               super__Rb_tree_header._M_node_count + 5),local_ed4);
                  pmVar21 = ::std::
                            map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                            ::at((map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                                  *)&__range4_3,(key_type_conflict3 *)(v.imag._M_elems + 2));
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_eb0);
                  pvVar20 = ::std::
                            vector<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                            ::operator[](&(ppVar27->second).rotations.samples,uStack_ed0);
                  pvVar22 = ::std::array<float,_4UL>::operator[](&pvVar20->value,0);
                  vVar1 = *pvVar22;
                  pfVar23 = tinyusdz::value::quatf::operator[]((quatf *)&joint_id_4,0);
                  *pfVar23 = vVar1;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_eb0);
                  pvVar20 = ::std::
                            vector<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                            ::operator[](&(ppVar27->second).rotations.samples,uStack_ed0);
                  pvVar22 = ::std::array<float,_4UL>::operator[](&pvVar20->value,1);
                  vVar1 = *pvVar22;
                  pfVar23 = tinyusdz::value::quatf::operator[]((quatf *)&joint_id_4,1);
                  *pfVar23 = vVar1;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_eb0);
                  pvVar20 = ::std::
                            vector<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                            ::operator[](&(ppVar27->second).rotations.samples,uStack_ed0);
                  pvVar22 = ::std::array<float,_4UL>::operator[](&pvVar20->value,2);
                  vVar1 = *pvVar22;
                  pfVar23 = tinyusdz::value::quatf::operator[]((quatf *)&joint_id_4,2);
                  *pfVar23 = vVar1;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_eb0);
                  pvVar20 = ::std::
                            vector<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                            ::operator[](&(ppVar27->second).rotations.samples,uStack_ed0);
                  pvVar22 = ::std::array<float,_4UL>::operator[](&pvVar20->value,3);
                  vVar1 = *pvVar22;
                  pfVar23 = tinyusdz::value::quatf::operator[]((quatf *)&joint_id_4,3);
                  *pfVar23 = vVar1;
                  pvVar24 = ::std::
                            vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                            ::operator[](pmVar21,local_10e0);
                  *(uint64_t *)(pvVar24->imag)._M_elems = joint_id_4;
                  *(undefined8 *)((pvVar24->imag)._M_elems + 2) = v.imag._M_elems._0_8_;
                  uStack_ed0 = uStack_ed0 + 1;
                }
                ppVar27 = ::std::
                          _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                          ::operator->(local_eb0);
                bVar9 = nonstd::optional_lite::optional::operator_cast_to_bool
                                  ((optional *)&(ppVar27->second).rotations);
                if (bVar9) {
                  ::std::__cxx11::string::string
                            ((string *)(v_1.imag._M_elems + 2),(string *)rot_it_1);
                  uVar41 = StringAndIdMap::at((StringAndIdMap *)&__range3,
                                              (string *)(v_1.imag._M_elems + 2));
                  ::std::__cxx11::string::~string((string *)(v_1.imag._M_elems + 2));
                  sVar37 = ::std::
                           vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                           size((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                 *)&__range4_4);
                  if (sVar37 < uVar41 + 1) {
                    ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                    resize((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                            *)&__range4_4,uVar41 + 1);
                  }
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_eb0);
                  pvVar25 = nonstd::optional_lite::optional<std::array<float,_4UL>_>::value
                                      (&(ppVar27->second).rotations.static_value);
                  pvVar22 = ::std::array<float,_4UL>::operator[](pvVar25,0);
                  vVar1 = *pvVar22;
                  pfVar23 = tinyusdz::value::quatf::operator[]((quatf *)&aval_1._ts._dirty,0);
                  *pfVar23 = vVar1;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_eb0);
                  pvVar25 = nonstd::optional_lite::optional<std::array<float,_4UL>_>::value
                                      (&(ppVar27->second).rotations.static_value);
                  pvVar22 = ::std::array<float,_4UL>::operator[](pvVar25,1);
                  vVar1 = *pvVar22;
                  pfVar23 = tinyusdz::value::quatf::operator[]((quatf *)&aval_1._ts._dirty,1);
                  *pfVar23 = vVar1;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_eb0);
                  pvVar25 = nonstd::optional_lite::optional<std::array<float,_4UL>_>::value
                                      (&(ppVar27->second).rotations.static_value);
                  pvVar22 = ::std::array<float,_4UL>::operator[](pvVar25,2);
                  vVar1 = *pvVar22;
                  pfVar23 = tinyusdz::value::quatf::operator[]((quatf *)&aval_1._ts._dirty,2);
                  *pfVar23 = vVar1;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_eb0);
                  pvVar25 = nonstd::optional_lite::optional<std::array<float,_4UL>_>::value
                                      (&(ppVar27->second).rotations.static_value);
                  pvVar22 = ::std::array<float,_4UL>::operator[](pvVar25,3);
                  vVar1 = *pvVar22;
                  pfVar23 = tinyusdz::value::quatf::operator[]((quatf *)&aval_1._ts._dirty,3);
                  *pfVar23 = vVar1;
                  pvVar24 = ::std::
                            vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                            ::operator[]((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                          *)&__range4_4,uVar41);
                  *(undefined8 *)(pvVar24->imag)._M_elems = aval_1._ts._24_8_;
                  *(undefined8 *)((pvVar24->imag)._M_elems + 2) = v_1.imag._M_elems._0_8_;
                }
              }
              ::std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
              ::operator++(&__end4_4);
            }
            Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
            ::Animatable((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                          *)&__range4_5);
            sVar37 = ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                     ::size((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                             *)&__range4_4);
            sVar44 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                               ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                local_d0);
            if (sVar37 == sVar44) {
              Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
              ::set_default((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                             *)&__range4_5,
                            (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                             *)&__range4_4);
            }
            __end4_5 = ::std::
                       map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                       ::begin((map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                                *)&__range4_3);
            s_1 = (pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                   *)::std::
                     map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                     ::end((map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                            *)&__range4_3);
            while (bVar9 = ::std::operator!=(&__end4_5,(_Self *)&s_1), bVar9) {
              scales.
              super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)::std::
                            _Rb_tree_iterator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                            ::operator*(&__end4_5);
              Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
              ::add_sample((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                            *)&__range4_5,
                           ((reference)
                           scales.
                           super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->first,
                           &((reference)
                            scales.
                            super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->second);
              ::std::
              _Rb_tree_iterator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
              ::operator++(&__end4_5);
            }
            TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
            ::set_value(&dst->rotations,
                        (Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                         *)&__range4_5);
            Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
            ::~Animatable((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                           *)&__range4_5);
            bVar9 = false;
LAB_0048cc39:
            ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::~vector
                      ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                       &__range4_4);
            ::std::
            map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
            ::~map((map<double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>_>
                    *)&__range4_3);
            ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&rot_it);
            if (bVar9) goto LAB_0048d7dd;
          }
          if (bVar5) {
            ::std::
            vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
            ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      *)local_11d0);
            sVar37 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                               ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                local_d0);
            local_11d6._M_elems[0] = tinyusdz::value::float_to_half_full(1.0);
            local_11d6._M_elems[1] = tinyusdz::value::float_to_half_full(1.0);
            local_11d6._M_elems[2] = tinyusdz::value::float_to_half_full(1.0);
            ::std::
            vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
            ::assign((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      *)local_11d0,sVar37,&local_11d6);
            Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
            ::Animatable((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                          *)&timeCodes_2._M_h._M_single_bucket,
                         (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          *)local_11d0);
            TypedAttribute<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
            ::set_value(&dst->scales,
                        (Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                         *)&timeCodes_2._M_h._M_single_bucket);
            Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
            ::~Animatable((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                           *)&timeCodes_2._M_h._M_single_bucket);
            ::std::
            vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
            ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                       *)local_11d0);
          }
          else {
            ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&scale_it);
            local_1268._M_node =
                 (_Base_ptr)
                 ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                 ::cbegin(&anim->channels_map);
            ppVar26 = ::std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
                      ::operator->(&local_1268);
            local_126c = Scale;
            local_1260._M_node =
                 (_Base_ptr)
                 ::std::
                 map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                 ::find(&ppVar26->second,&local_126c);
            local_1258 = &local_1260;
            t_4 = (size_t)::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                          ::cbegin(&anim->channels_map);
            ppVar26 = ::std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
                      ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
                                    *)&t_4);
            local_1278._M_node =
                 (_Base_ptr)
                 ::std::
                 map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                 ::end(&ppVar26->second);
            bVar9 = ::std::operator!=(&local_1260,&local_1278);
            if (bVar9) {
              local_1288 = 0;
              while( true ) {
                uVar7 = local_1288;
                ppVar27 = ::std::
                          _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                          ::operator->(local_1258);
                sVar37 = ::std::
                         vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                         ::size(&(ppVar27->second).scales.samples);
                if (sVar37 <= uVar7) break;
                ppVar27 = ::std::
                          _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                          ::operator->(local_1258);
                pvVar28 = ::std::
                          vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                          ::operator[](&(ppVar27->second).scales.samples,local_1288);
                local_128c = ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                       ((anon_class_1_0_00000001 *)
                                        ((long)&joint_idMap._s_to_i._M_t._M_impl.
                                                super__Rb_tree_header._M_node_count + 7),pvVar28->t)
                ;
                pVar47 = ::std::
                         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                   *)&scale_it,&local_128c);
                ts_scales._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     (size_t)pVar47.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
                local_1288 = local_1288 + 1;
              }
            }
            ::std::
            map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
            ::map((map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                   *)&__range4_6);
            __end4_6 = ::std::
                       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)&scale_it);
            tc_4 = (uint *)::std::
                           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)&scale_it);
            while (bVar9 = ::std::__detail::operator!=
                                     (&__end4_6.super__Node_iterator_base<unsigned_int,_false>,
                                      (_Node_iterator_base<unsigned_int,_false> *)&tc_4), bVar9) {
              puVar39 = ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*
                                  (&__end4_6);
              fVar46 = ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                 ((anon_class_1_0_00000001 *)
                                  ((long)&joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count + 6),*puVar39);
              static_scales.
              super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                      ((anon_class_1_0_00000001 *)
                                       ((long)&joint_idMap._s_to_i._M_t._M_impl.
                                               super__Rb_tree_header._M_node_count + 5),fVar46);
              pmVar29 = ::std::
                        map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                        ::operator[]((map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                                      *)&__range4_6,
                                     (key_type_conflict3 *)
                                     &static_scales.
                                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              sVar37 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                 ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                  local_d0);
              ::std::
              vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              ::resize(pmVar29,sVar37);
              ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end4_6);
            }
            ::std::
            vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
            ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      *)&__range4_7);
            __end4_7 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                       ::begin(&anim->channels_map);
            channels_5 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>
                          *)::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                            ::end(&anim->channels_map);
            while (bVar9 = ::std::operator!=(&__end4_7,(_Self *)&channels_5), bVar9) {
              scale_it_1 = (const_iterator *)
                           ::std::
                           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
                           ::operator*(&__end4_7);
              local_1344 = Scale;
              local_1340._M_node =
                   (_Base_ptr)
                   ::std::
                   map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                   ::find(&((reference)scale_it_1)->second,&local_1344);
              local_1338 = &local_1340;
              t_5 = (size_t)::std::
                            map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                            ::end((map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                                   *)(scale_it_1 + 4));
              bVar9 = ::std::operator!=(&local_1340,(_Self *)&t_5);
              if (bVar9) {
                uStack_1358 = 0;
                while( true ) {
                  uVar7 = uStack_1358;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_1338);
                  sVar37 = ::std::
                           vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                           ::size(&(ppVar27->second).scales.samples);
                  if (sVar37 <= uVar7) break;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_1338);
                  pvVar28 = ::std::
                            vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                            ::operator[](&(ppVar27->second).scales.samples,uStack_1358);
                  local_135c = pvVar28->t;
                  local_1360 = ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                         ((anon_class_1_0_00000001 *)
                                          ((long)&joint_idMap._s_to_i._M_t._M_impl.
                                                  super__Rb_tree_header._M_node_count + 7),
                                          local_135c);
                  sVar40 = ::std::
                           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                    *)&scale_it,&local_1360);
                  if (sVar40 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream(local_14d8);
                    poVar17 = ::std::operator<<((ostream *)local_14d8,"[error]");
                    poVar17 = ::std::operator<<(poVar17,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                               );
                    poVar17 = ::std::operator<<(poVar17,":");
                    poVar17 = ::std::operator<<(poVar17,"ExportSkelAnimation");
                    poVar17 = ::std::operator<<(poVar17,"():");
                    poVar17 = (ostream *)::std::ostream::operator<<(poVar17,0x1bd);
                    ::std::operator<<(poVar17," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_1518,
                               "All animation channels should have same timeCodes. timeCode {} is only seen in `scale` animation channel of joint {}"
                               ,&local_1519);
                    fmt::format<float,std::__cxx11::string>
                              (&local_14f8,(fmt *)local_1518,(string *)&local_135c,
                               (float *)scale_it_1,in_R8);
                    poVar17 = ::std::operator<<((ostream *)local_14d8,(string *)&local_14f8);
                    ::std::operator<<(poVar17,"\n");
                    ::std::__cxx11::string::~string((string *)&local_14f8);
                    ::std::__cxx11::string::~string(local_1518);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_1519);
                    if (err != (string *)0x0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::operator+(&local_1540,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&joint_id_5,"\n");
                      ::std::__cxx11::string::operator+=((string *)err,(string *)&local_1540);
                      ::std::__cxx11::string::~string((string *)&local_1540);
                      ::std::__cxx11::string::~string((string *)&joint_id_5);
                    }
                    anim_local._7_1_ = 0;
                    bVar9 = true;
                    ::std::__cxx11::ostringstream::~ostringstream(local_14d8);
                    goto LAB_0048d7a1;
                  }
                  ::std::__cxx11::string::string((string *)&scales_1,(string *)scale_it_1);
                  uVar41 = StringAndIdMap::at((StringAndIdMap *)&__range3,(string *)&scales_1);
                  ::std::__cxx11::string::~string((string *)&scales_1);
                  local_1568 = uVar41;
                  dStack_1598 = ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                          ((anon_class_1_0_00000001 *)
                                           ((long)&joint_idMap._s_to_i._M_t._M_impl.
                                                   super__Rb_tree_header._M_node_count + 5),
                                           local_135c);
                  pmVar29 = ::std::
                            map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                            ::at((map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                                  *)&__range4_6,&stack0xffffffffffffea68);
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_1338);
                  pvVar28 = ::std::
                            vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                            ::operator[](&(ppVar27->second).scales.samples,uStack_1358);
                  pvVar30 = ::std::array<float,_3UL>::operator[](&pvVar28->value,0);
                  hVar11 = tinyusdz::value::float_to_half_full(*pvVar30);
                  pvVar31 = ::std::array<tinyusdz::value::half,_3UL>::operator[](&local_159e,0);
                  pvVar31->value = hVar11.value;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_1338);
                  pvVar28 = ::std::
                            vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                            ::operator[](&(ppVar27->second).scales.samples,uStack_1358);
                  pvVar30 = ::std::array<float,_3UL>::operator[](&pvVar28->value,1);
                  hVar11 = tinyusdz::value::float_to_half_full(*pvVar30);
                  pvVar31 = ::std::array<tinyusdz::value::half,_3UL>::operator[](&local_159e,1);
                  pvVar31->value = hVar11.value;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_1338);
                  pvVar28 = ::std::
                            vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                            ::operator[](&(ppVar27->second).scales.samples,uStack_1358);
                  pvVar30 = ::std::array<float,_3UL>::operator[](&pvVar28->value,2);
                  hVar11 = tinyusdz::value::float_to_half_full(*pvVar30);
                  pvVar31 = ::std::array<tinyusdz::value::half,_3UL>::operator[](&local_159e,2);
                  pvVar31->value = hVar11.value;
                  pvVar32 = ::std::
                            vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            ::operator[](pmVar29,local_1568);
                  *(undefined4 *)pvVar32->_M_elems = local_159e._M_elems._0_4_;
                  pvVar32->_M_elems[2].value = local_159e._M_elems[2].value;
                  uStack_1358 = uStack_1358 + 1;
                }
                ppVar27 = ::std::
                          _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                          ::operator->(local_1338);
                bVar9 = nonstd::optional_lite::optional::operator_cast_to_bool
                                  ((optional *)&(ppVar27->second).scales);
                if (bVar9) {
                  ::std::__cxx11::string::string((string *)local_15d0,(string *)scale_it_1);
                  uVar41 = StringAndIdMap::at((StringAndIdMap *)&__range3,(string *)local_15d0);
                  ::std::__cxx11::string::~string((string *)local_15d0);
                  sVar37 = ::std::
                           vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                           ::size((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                   *)&__range4_7);
                  if (sVar37 < uVar41 + 1) {
                    ::std::
                    vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    ::resize((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                              *)&__range4_7,uVar41 + 1);
                  }
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_1338);
                  pvVar33 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                                      (&(ppVar27->second).scales.static_value);
                  pvVar30 = ::std::array<float,_3UL>::operator[](pvVar33,0);
                  hVar11 = tinyusdz::value::float_to_half_full(*pvVar30);
                  pvVar31 = ::std::array<tinyusdz::value::half,_3UL>::operator[](&local_15d6,0);
                  pvVar31->value = hVar11.value;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_1338);
                  pvVar33 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                                      (&(ppVar27->second).scales.static_value);
                  pvVar30 = ::std::array<float,_3UL>::operator[](pvVar33,1);
                  aval_2._ts._30_2_ = tinyusdz::value::float_to_half_full(*pvVar30);
                  pvVar31 = ::std::array<tinyusdz::value::half,_3UL>::operator[](&local_15d6,1);
                  pvVar31->value = aval_2._ts._30_2_;
                  ppVar27 = ::std::
                            _Rb_tree_const_iterator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>
                            ::operator->(local_1338);
                  pvVar33 = nonstd::optional_lite::optional<std::array<float,_3UL>_>::value
                                      (&(ppVar27->second).scales.static_value);
                  pvVar30 = ::std::array<float,_3UL>::operator[](pvVar33,2);
                  aval_2._ts._28_2_ = tinyusdz::value::float_to_half_full(*pvVar30);
                  pvVar31 = ::std::array<tinyusdz::value::half,_3UL>::operator[](&local_15d6,2);
                  pvVar31->value = aval_2._ts._28_2_;
                  pvVar32 = ::std::
                            vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            ::operator[]((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                          *)&__range4_7,uVar41);
                  *(undefined4 *)pvVar32->_M_elems = local_15d6._M_elems._0_4_;
                  pvVar32->_M_elems[2].value = local_15d6._M_elems[2].value;
                }
              }
              ::std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>
              ::operator++(&__end4_7);
            }
            Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
            ::Animatable((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                          *)&__range4_8);
            sVar37 = ::std::
                     vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     ::size((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                             *)&__range4_7);
            sVar44 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                               ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                local_d0);
            if (sVar37 == sVar44) {
              Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
              ::set_default((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                             *)&__range4_8,
                            (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                             *)&__range4_7);
            }
            __end4_8 = ::std::
                       map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                       ::begin((map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                                *)&__range4_6);
            s_2 = (pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                   *)::std::
                     map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                     ::end((map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                            *)&__range4_6);
            while (bVar9 = ::std::operator!=(&__end4_8,(_Self *)&s_2), bVar9) {
              target_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   (size_t)::std::
                           _Rb_tree_iterator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                           ::operator*(&__end4_8);
              Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
              ::add_sample((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                            *)&__range4_8,
                           ((reference)
                           target_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count)->
                           first,&((reference)
                                  target_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count)->second);
              ::std::
              _Rb_tree_iterator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
              ::operator++(&__end4_8);
            }
            TypedAttribute<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
            ::set_value(&dst->scales,
                        (Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                         *)&__range4_8);
            Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
            ::~Animatable((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                           *)&__range4_8);
            bVar9 = false;
LAB_0048d7a1:
            ::std::
            vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
            ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                       *)&__range4_7);
            ::std::
            map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
            ::~map((map<double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>_>
                    *)&__range4_6);
            ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&scale_it);
            if (bVar9) goto LAB_0048d7dd;
          }
          bVar9 = false;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_660);
          poVar17 = ::std::operator<<((ostream *)local_660,"[error]");
          poVar17 = ::std::operator<<(poVar17,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                     );
          poVar17 = ::std::operator<<(poVar17,":");
          poVar17 = ::std::operator<<(poVar17,"ExportSkelAnimation");
          poVar17 = ::std::operator<<(poVar17,"():");
          poVar17 = (ostream *)::std::ostream::operator<<(poVar17,0xfb);
          ::std::operator<<(poVar17," ");
          poVar17 = ::std::operator<<((ostream *)local_660,
                                      "scale channel partially exists among joints. No joints have animation channel or all joints have animation channels."
                                     );
          ::std::operator<<(poVar17,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(&local_680,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &translations.
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,"\n");
            ::std::__cxx11::string::operator+=((string *)err,(string *)&local_680);
            ::std::__cxx11::string::~string((string *)&local_680);
            ::std::__cxx11::string::~string
                      ((string *)
                       &translations.
                        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          anim_local._7_1_ = 0;
          bVar9 = true;
          ::std::__cxx11::ostringstream::~ostringstream(local_660);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_4a8);
        poVar17 = ::std::operator<<((ostream *)local_4a8,"[error]");
        poVar17 = ::std::operator<<(poVar17,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                   );
        poVar17 = ::std::operator<<(poVar17,":");
        poVar17 = ::std::operator<<(poVar17,"ExportSkelAnimation");
        poVar17 = ::std::operator<<(poVar17,"():");
        poVar17 = (ostream *)::std::ostream::operator<<(poVar17,0xf7);
        ::std::operator<<(poVar17," ");
        poVar17 = ::std::operator<<((ostream *)local_4a8,
                                    "rotation channel partially exists among joints. No joints have animation channel or all joints have animation channels."
                                   );
        ::std::operator<<(poVar17,"\n");
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(&local_4c8,&local_4e8,"\n");
          ::std::__cxx11::string::operator+=((string *)err,(string *)&local_4c8);
          ::std::__cxx11::string::~string((string *)&local_4c8);
          ::std::__cxx11::string::~string((string *)&local_4e8);
        }
        anim_local._7_1_ = 0;
        bVar9 = true;
        ::std::__cxx11::ostringstream::~ostringstream(local_4a8);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_2e8);
      poVar17 = ::std::operator<<((ostream *)local_2e8,"[error]");
      poVar17 = ::std::operator<<(poVar17,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                 );
      poVar17 = ::std::operator<<(poVar17,":");
      poVar17 = ::std::operator<<(poVar17,"ExportSkelAnimation");
      poVar17 = ::std::operator<<(poVar17,"():");
      poVar17 = (ostream *)::std::ostream::operator<<(poVar17,0xf3);
      ::std::operator<<(poVar17," ");
      poVar17 = ::std::operator<<((ostream *)local_2e8,
                                  "translation channel partially exists among joints. No joints have animation channel or all joints have animation channels."
                                 );
      ::std::operator<<(poVar17,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(&local_308,&local_328,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_308);
        ::std::__cxx11::string::~string((string *)&local_308);
        ::std::__cxx11::string::~string((string *)&local_328);
      }
      anim_local._7_1_ = 0;
      bVar9 = true;
      ::std::__cxx11::ostringstream::~ostringstream(local_2e8);
    }
LAB_0048d7dd:
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_d0);
    StringAndIdMap::~StringAndIdMap((StringAndIdMap *)&__range3);
    if (bVar9) goto LAB_0048e1da;
  }
  sVar34 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
           ::size(&anim->blendshape_weights_map);
  if (sVar34 == 0) {
    TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>::
    set_value_empty(&dst->blendShapeWeights);
  }
  else {
    StringAndIdMap::StringAndIdMap((StringAndIdMap *)&__range3_3);
    __end3_3 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
               ::begin(&anim->blendshape_weights_map);
    target = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>
              *)::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                ::end(&anim->blendshape_weights_map);
    while (bVar9 = ::std::operator!=(&__end3_3,(_Self *)&target), bVar9) {
      key_00 = ::std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>
               ::operator*(&__end3_3);
      blendShapes.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)StringAndIdMap::size((StringAndIdMap *)&__range3_3);
      StringAndIdMap::add((StringAndIdMap *)&__range3_3,&key_00->first,
                          (uint64_t)
                          blendShapes.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>
      ::operator++(&__end3_3);
    }
    sVar15 = StringAndIdMap::size((StringAndIdMap *)&__range3_3);
    ::std::allocator<tinyusdz::Token>::allocator
              ((allocator<tinyusdz::Token> *)((long)&__range3_4 + 7));
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_16e0,sVar15,
               (allocator_type *)((long)&__range3_4 + 7));
    ::std::allocator<tinyusdz::Token>::~allocator
              ((allocator<tinyusdz::Token> *)((long)&__range3_4 + 7));
    __end3_4 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
               ::begin(&anim->blendshape_weights_map);
    target_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>
                *)::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                  ::end(&anim->blendshape_weights_map);
    while (bVar9 = ::std::operator!=(&__end3_4,(_Self *)&target_1), bVar9) {
      local_1708 = ::std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>
                   ::operator*(&__end3_4);
      Token::Token(&local_1728,&local_1708->first);
      ::std::__cxx11::string::string
                ((string *)&timeCodes_3._M_h._M_single_bucket,(string *)local_1708);
      uVar41 = StringAndIdMap::at((StringAndIdMap *)&__range3_3,
                                  (string *)&timeCodes_3._M_h._M_single_bucket);
      pvVar35 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                          ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_16e0,
                           uVar41);
      Token::operator=(pvVar35,&local_1728);
      ::std::__cxx11::string::~string((string *)&timeCodes_3._M_h._M_single_bucket);
      Token::~Token(&local_1728);
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>
      ::operator++(&__end3_4);
    }
    TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::operator=
              (&dst->blendShapes,
               (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_16e0);
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&weights_it);
    t_6 = (size_t)::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                  ::cbegin(&anim->blendshape_weights_map);
    local_1788 = (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>
                  *)&t_6;
    local_1798 = 0;
    while( true ) {
      uVar7 = local_1798;
      ppVar36 = ::std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>
                ::operator->(local_1788);
      sVar37 = ::std::
               vector<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
               ::size(&(ppVar36->second).samples);
      if (sVar37 <= uVar7) break;
      ppVar36 = ::std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>
                ::operator->(local_1788);
      pvVar38 = ::std::
                vector<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
                ::operator[](&(ppVar36->second).samples,local_1798);
      local_179c = ExportSkelAnimation::anon_class_1_0_00000001::operator()
                             ((anon_class_1_0_00000001 *)
                              ((long)&joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count + 7),pvVar38->t);
      pVar47 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&weights_it,&local_179c);
      ts_weights._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)pVar47.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
      local_1798 = local_1798 + 1;
    }
    ::std::
    map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::map((map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
           *)&__range3_5);
    __end3_5 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&weights_it);
    tc_6 = (uint *)::std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&weights_it);
    while (bVar9 = ::std::__detail::operator!=
                             (&__end3_5.super__Node_iterator_base<unsigned_int,_false>,
                              (_Node_iterator_base<unsigned_int,_false> *)&tc_6), bVar9) {
      puVar39 = ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end3_5);
      fVar46 = ExportSkelAnimation::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)
                          ((long)&joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count + 6),*puVar39);
      static_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)ExportSkelAnimation::anon_class_1_0_00000001::operator()
                              ((anon_class_1_0_00000001 *)
                               ((long)&joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count + 5),fVar46);
      this_00 = ::std::
                map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                ::operator[]((map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                              *)&__range3_5,
                             (key_type_conflict3 *)
                             &static_weights.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar37 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                         ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_16e0);
      ::std::vector<float,_std::allocator<float>_>::resize(this_00,sVar37);
      ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end3_5);
    }
    ::std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&__range3_6);
    __end3_6 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
               ::begin(&anim->blendshape_weights_map);
    target_2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>
                *)::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                  ::end(&anim->blendshape_weights_map);
    while (bVar9 = ::std::operator!=(&__end3_6,(_Self *)&target_2), bVar9) {
      t_7 = (size_t)::std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>
                    ::operator*(&__end3_6);
      for (uStack_1848 = 0; uVar7 = uStack_1848,
          sVar37 = ::std::
                   vector<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
                   ::size((vector<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
                           *)(t_7 + 0x28)), uVar7 < sVar37; uStack_1848 = uStack_1848 + 1) {
        pvVar38 = ::std::
                  vector<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
                  ::operator[]((vector<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
                                *)(t_7 + 0x28),uStack_1848);
        local_184c = pvVar38->t;
        local_1850 = ExportSkelAnimation::anon_class_1_0_00000001::operator()
                               ((anon_class_1_0_00000001 *)
                                ((long)&joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count + 7),local_184c);
        sVar40 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)&weights_it,&local_1850);
        if (sVar40 == 0) {
          ::std::__cxx11::ostringstream::ostringstream(local_19c8);
          poVar17 = ::std::operator<<((ostream *)local_19c8,"[error]");
          poVar17 = ::std::operator<<(poVar17,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                     );
          poVar17 = ::std::operator<<(poVar17,":");
          poVar17 = ::std::operator<<(poVar17,"ExportSkelAnimation");
          poVar17 = ::std::operator<<(poVar17,"():");
          poVar17 = (ostream *)::std::ostream::operator<<(poVar17,0x206);
          ::std::operator<<(poVar17," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1a08,
                     "All blendshape weights should have same timeCodes. timeCode {} is only seen in `blendShapeWeights` animation channel of blendShape {}"
                     ,&local_1a09);
          fmt::format<float,std::__cxx11::string>
                    (&local_19e8,(fmt *)local_1a08,(string *)&local_184c,(float *)t_7,in_R8);
          poVar17 = ::std::operator<<((ostream *)local_19c8,(string *)&local_19e8);
          ::std::operator<<(poVar17,"\n");
          ::std::__cxx11::string::~string((string *)&local_19e8);
          ::std::__cxx11::string::~string(local_1a08);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1a09);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(&local_1a30,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &target_id_1,"\n");
            ::std::__cxx11::string::operator+=((string *)err,(string *)&local_1a30);
            ::std::__cxx11::string::~string((string *)&local_1a30);
            ::std::__cxx11::string::~string((string *)&target_id_1);
          }
          anim_local._7_1_ = 0;
          bVar9 = true;
          ::std::__cxx11::ostringstream::~ostringstream(local_19c8);
          goto LAB_0048e12c;
        }
        ::std::__cxx11::string::string((string *)&weights,(string *)t_7);
        uVar41 = StringAndIdMap::at((StringAndIdMap *)&__range3_3,(string *)&weights);
        ::std::__cxx11::string::~string((string *)&weights);
        local_1a58 = uVar41;
        target_id_2 = (uint64_t)
                      ExportSkelAnimation::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)
                                 ((long)&joint_idMap._s_to_i._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count + 5),local_184c);
        local_1a80 = ::std::
                     map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                     ::at((map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                           *)&__range3_5,(key_type_conflict3 *)&target_id_2);
        pvVar38 = ::std::
                  vector<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
                  ::operator[]((vector<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
                                *)(t_7 + 0x28),uStack_1848);
        fVar46 = pvVar38->value;
        pvVar42 = ::std::vector<float,_std::allocator<float>_>::operator[](local_1a80,local_1a58);
        *pvVar42 = fVar46;
      }
      bVar9 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(t_7 + 0x20));
      if (bVar9) {
        ::std::__cxx11::string::string((string *)&aval_3._ts._dirty,(string *)t_7);
        uVar41 = StringAndIdMap::at((StringAndIdMap *)&__range3_3,(string *)&aval_3._ts._dirty);
        ::std::__cxx11::string::~string((string *)&aval_3._ts._dirty);
        sVar37 = ::std::vector<float,_std::allocator<float>_>::size
                           ((vector<float,_std::allocator<float>_> *)&__range3_6);
        if (sVar37 < uVar41 + 1) {
          ::std::vector<float,_std::allocator<float>_>::resize
                    ((vector<float,_std::allocator<float>_> *)&__range3_6,uVar41 + 1);
        }
        pvVar43 = nonstd::optional_lite::optional<float>::value((optional<float> *)(t_7 + 0x20));
        vVar1 = *pvVar43;
        pvVar42 = ::std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)&__range3_6,uVar41);
        *pvVar42 = vVar1;
      }
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>
      ::operator++(&__end3_6);
    }
    Animatable<std::vector<float,_std::allocator<float>_>_>::Animatable
              ((Animatable<std::vector<float,_std::allocator<float>_>_> *)&__range3_7);
    sVar37 = ::std::vector<float,_std::allocator<float>_>::size
                       ((vector<float,_std::allocator<float>_> *)&__range3_6);
    sVar44 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                       ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_16e0);
    if (sVar37 == sVar44) {
      Animatable<std::vector<float,_std::allocator<float>_>_>::set_default
                ((Animatable<std::vector<float,_std::allocator<float>_>_> *)&__range3_7,
                 (vector<float,_std::allocator<float>_> *)&__range3_6);
    }
    __end3_7 = ::std::
               map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::begin((map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                        *)&__range3_5);
    s_3 = (pair<const_double,_std::vector<float,_std::allocator<float>_>_> *)
          ::std::
          map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
          ::end((map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
                 *)&__range3_5);
    while (bVar9 = ::std::operator!=(&__end3_7,(_Self *)&s_3), bVar9) {
      ppVar45 = ::std::
                _Rb_tree_iterator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>
                ::operator*(&__end3_7);
      Animatable<std::vector<float,_std::allocator<float>_>_>::add_sample
                ((Animatable<std::vector<float,_std::allocator<float>_>_> *)&__range3_7,
                 ppVar45->first,&ppVar45->second);
      ::std::
      _Rb_tree_iterator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>::
      operator++(&__end3_7);
    }
    TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>::set_value
              (&dst->blendShapeWeights,
               (Animatable<std::vector<float,_std::allocator<float>_>_> *)&__range3_7);
    Animatable<std::vector<float,_std::allocator<float>_>_>::~Animatable
              ((Animatable<std::vector<float,_std::allocator<float>_>_> *)&__range3_7);
    bVar9 = false;
LAB_0048e12c:
    ::std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&__range3_6);
    ::std::
    map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::~map((map<double,_std::vector<float,_std::allocator<float>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::vector<float,_std::allocator<float>_>_>_>_>
            *)&__range3_5);
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&weights_it);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_16e0);
    StringAndIdMap::~StringAndIdMap((StringAndIdMap *)&__range3_3);
    if (bVar9) goto LAB_0048e1da;
  }
  ::std::__cxx11::string::operator=((string *)dst,(string *)anim);
  lVar12 = ::std::__cxx11::string::size();
  if (lVar12 != 0) {
    pPVar13 = SkelAnimation::metas(dst);
    nonstd::optional_lite::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&pPVar13->displayName,&anim->display_name);
  }
  anim_local._7_1_ = 1;
LAB_0048e1da:
  return (bool)(anim_local._7_1_ & 1);
}

Assistant:

static bool ExportSkelAnimation(const Animation &anim, SkelAnimation *dst, std::string *err) {
  (void)err;
  dst->name = anim.prim_name;
  if (anim.display_name.size()) {
    dst->metas().displayName = anim.display_name;
  }

  auto float_to_uint = [](const float x) {
    union Fp {
      float f;
      uint32_t u;
    };
    Fp fp;
    fp.f = x;
 
    return fp.u;
  };

  auto uint_to_float = [](const uint32_t x) {
    union Fp {
      float f;
      uint32_t u;
    };
    Fp fp;
    fp.u = x;
 
    return fp.f;
  };

  // inf and nan(TimeCode::Default) aware upcast
  auto float_to_double = [](const float x) {
    if (std::isnan(x)) {
      return value::TimeCode::Default();
    }
    if (std::isinf(x)) {
      if (std::signbit(x)) {
        return -std::numeric_limits<double>::infinity();
      } else {
        return std::numeric_limits<double>::infinity();
      }
    }
    return double(x);
  };

  if (anim.channels_map.size()) {

    StringAndIdMap joint_idMap;
    for (const auto &channels : anim.channels_map)
    {
      uint64_t joint_id = uint64_t(joint_idMap.size());
      joint_idMap.add(channels.first, uint64_t(joint_id));
    }

    std::vector<value::token> joints(joint_idMap.size());
    for (const auto &channels : anim.channels_map) {
      joints[size_t(joint_idMap.at(channels.first))] = value::token(channels.first);
    }
    dst->joints = joints;

    bool no_tx_channel{true};
    bool no_rot_channel{true};
    bool no_scale_channel{true};

    bool all_joints_has_tx_channel{true};
    bool all_joints_has_rot_channel{true};
    bool all_joints_has_scale_channel{true};

    for (const auto &channels : anim.channels_map) {

      bool has_tx_channel;
      bool has_rot_channel;
      bool has_scale_channel;

      has_tx_channel = channels.second.count(AnimationChannel::ChannelType::Translation);
      has_rot_channel = channels.second.count(AnimationChannel::ChannelType::Rotation);
      has_scale_channel = channels.second.count(AnimationChannel::ChannelType::Scale);

      if (has_tx_channel) {
        no_tx_channel = false;
      } else {
        all_joints_has_tx_channel = false;
      }

      if (has_rot_channel) {
        no_rot_channel = false;
      } else {
        all_joints_has_rot_channel = false;
      }

      if (has_scale_channel) {
        no_scale_channel = false;
      } else {
        all_joints_has_scale_channel = false;
      }
    }

    if (!no_tx_channel && !all_joints_has_tx_channel) {
      PUSH_ERROR_AND_RETURN("translation channel partially exists among joints. No joints have animation channel or all joints have animation channels.");
    }

    if (!no_rot_channel && !all_joints_has_rot_channel) {
      PUSH_ERROR_AND_RETURN("rotation channel partially exists among joints. No joints have animation channel or all joints have animation channels.");
    }

    if (!no_scale_channel && !all_joints_has_scale_channel) {
      PUSH_ERROR_AND_RETURN("scale channel partially exists among joints. No joints have animation channel or all joints have animation channels.");
    }

    if (no_tx_channel) {
      // Author static(default) value.
      std::vector<value::float3> translations;
      translations.assign(joints.size(), {1.0f, 1.0f, 1.0f});
      
      dst->translations.set_value(translations);
    } else {

      // All joints should have same timeCode.
      // First collect timeCodes for the first joint.
      //
      // when timeCode is NaN(value::TimeCode::Default), the behavior(key compare in unordered_set) is undefined,
      // so use byte representation.
      std::unordered_set<uint32_t> timeCodes;

      {
        const auto &tx_it = anim.channels_map.cbegin()->second.find(AnimationChannel::ChannelType::Translation);
        if (tx_it != anim.channels_map.cbegin()->second.end()) {
          for (size_t t = 0; t < tx_it->second.translations.samples.size(); t++) {
            timeCodes.insert(float_to_uint(tx_it->second.translations.samples[t].t));
          }
        }
      }

      // key: timeCode. value: values for each joints.
      std::map<double, std::vector<value::float3>> ts_txs;
      for (const auto &tc : timeCodes) {
        ts_txs[float_to_double(uint_to_float(tc))].resize(joints.size()); 
      }

      std::vector<value::float3> static_txs;

      // Pack channel values
      for (const auto &channels : anim.channels_map) {

        const auto &tx_it = channels.second.find(AnimationChannel::ChannelType::Translation);
        if (tx_it != channels.second.end()) {

          for (size_t t = 0; t < tx_it->second.translations.samples.size(); t++) {
            float tc = tx_it->second.translations.samples[t].t;
            if (!timeCodes.count(float_to_uint(tc))) {
              PUSH_ERROR_AND_RETURN(fmt::format("All animation channels should have same timeCodes. timeCode {} is only seen in `translation` animation channel of joint {}", tc, channels.first));
            }
            uint64_t joint_id = joint_idMap.at(channels.first);

            std::vector<value::float3> &txs = ts_txs.at(float_to_double(tc));
            // just in case
            if (joint_id > txs.size()) {
              PUSH_ERROR_AND_RETURN(fmt::format("Internal error. joint_id {} exceeds # of joints {}", joint_id, txs.size()));
            }
            txs[size_t(joint_id)] = tx_it->second.translations.samples[t].value;
          }

          if (tx_it->second.translations.static_value) {
            uint64_t joint_id = joint_idMap.at(channels.first);
            if ((joint_id +1) > static_txs.size()) {
              static_txs.resize(size_t(joint_id+1));
            }
            static_txs[size_t(joint_id)] = tx_it->second.translations.static_value.value(); 
          }
        }
      }

      Animatable<std::vector<value::float3>> aval;
      if (static_txs.size() == joints.size()) {
        // Author static(default) value.
        aval.set_default(static_txs);
      }

      for (const auto &s : ts_txs) {
        aval.add_sample(s.first, s.second);
      } 

      dst->translations.set_value(aval);
    }

    if (no_rot_channel) {
      // Author static(default) value.
      std::vector<value::quatf> rots;
      value::quatf q;
      q.imag = {0.0f, 0.0f, 0.0f};
      q.real = 1.0f;
      rots.assign(joints.size(), q);

      dst->rotations.set_value(rots);
      
    } else {

      std::unordered_set<uint32_t> timeCodes;

      {
        const auto &rot_it = anim.channels_map.cbegin()->second.find(AnimationChannel::ChannelType::Rotation);
        if (rot_it != anim.channels_map.cbegin()->second.end()) {
          for (size_t t = 0; t < rot_it->second.rotations.samples.size(); t++) {
            timeCodes.insert(float_to_uint(rot_it->second.rotations.samples[t].t));
          }
        }

      }

      std::map<double, std::vector<value::quatf>> ts_rots;
      for (const auto &tc : timeCodes) {
        ts_rots[float_to_double(uint_to_float(tc))].resize(joints.size()); 
      }

      std::vector<value::quatf> static_rots;

      for (const auto &channels : anim.channels_map) {

        const auto &rot_it = channels.second.find(AnimationChannel::ChannelType::Rotation);
        if (rot_it != channels.second.end()) {

          for (size_t t = 0; t < rot_it->second.rotations.samples.size(); t++) {
            float tc = rot_it->second.rotations.samples[t].t;
            if (!timeCodes.count(float_to_uint(tc))) {
              PUSH_ERROR_AND_RETURN(fmt::format("All animation channels should have same timeCodes. timeCode {} is only seen in `rotation` animation channel of joint {}", tc, channels.first));
            }
            uint64_t joint_id = joint_idMap.at(channels.first);

            std::vector<value::quatf> &rots = ts_rots.at(float_to_double(tc));
            value::quatf v;
            v[0] = rot_it->second.rotations.samples[t].value[0];
            v[1] = rot_it->second.rotations.samples[t].value[1];
            v[2] = rot_it->second.rotations.samples[t].value[2];
            v[3] = rot_it->second.rotations.samples[t].value[3];
            rots[size_t(joint_id)] = v;
          }

          if (rot_it->second.rotations.static_value) {
            uint64_t joint_id = joint_idMap.at(channels.first);
            if ((joint_id +1) > static_rots.size()) {
              static_rots.resize(size_t(joint_id+1));
            }
            value::quatf v;
            v[0] = rot_it->second.rotations.static_value.value()[0];
            v[1] = rot_it->second.rotations.static_value.value()[1];
            v[2] = rot_it->second.rotations.static_value.value()[2];
            v[3] = rot_it->second.rotations.static_value.value()[3];
            static_rots[size_t(joint_id)] = v;
          }
        }
      }

      Animatable<std::vector<value::quatf>> aval;
      if (static_rots.size() == joints.size()) {
        // Author static(default) value.
        aval.set_default(static_rots);
      }

      for (const auto &s : ts_rots) {
        aval.add_sample(s.first, s.second);
      } 

      dst->rotations.set_value(aval);
    }

    if (no_scale_channel) {
      // Author static(default) value.
      std::vector<value::half3> scales;
      scales.assign(joints.size(), {value::float_to_half_full(1.0f), value::float_to_half_full(1.0f), value::float_to_half_full(1.0f)});

      dst->scales.set_value(scales);
      
    } else {
      std::unordered_set<uint32_t> timeCodes;

      {
        const auto &scale_it = anim.channels_map.cbegin()->second.find(AnimationChannel::ChannelType::Scale);
        if (scale_it != anim.channels_map.cbegin()->second.end()) {
          for (size_t t = 0; t < scale_it->second.scales.samples.size(); t++) {
            timeCodes.insert(float_to_uint(scale_it->second.scales.samples[t].t));
          }
        }

      }

      std::map<double, std::vector<value::half3>> ts_scales;
      for (const auto &tc : timeCodes) {
        ts_scales[float_to_double(uint_to_float(tc))].resize(joints.size()); 
      }

      std::vector<value::half3> static_scales;

      for (const auto &channels : anim.channels_map) {

        const auto &scale_it = channels.second.find(AnimationChannel::ChannelType::Scale);
        if (scale_it != channels.second.end()) {

          for (size_t t = 0; t < scale_it->second.scales.samples.size(); t++) {
            float tc = scale_it->second.scales.samples[t].t;
            if (!timeCodes.count(float_to_uint(tc))) {
              PUSH_ERROR_AND_RETURN(fmt::format("All animation channels should have same timeCodes. timeCode {} is only seen in `scale` animation channel of joint {}", tc, channels.first));
            }
            uint64_t joint_id = joint_idMap.at(channels.first);

            std::vector<value::half3> &scales = ts_scales.at(float_to_double(tc));
            value::half3 v;
            v[0] = value::float_to_half_full(scale_it->second.scales.samples[t].value[0]);
            v[1] = value::float_to_half_full(scale_it->second.scales.samples[t].value[1]);
            v[2] = value::float_to_half_full(scale_it->second.scales.samples[t].value[2]);
            scales[size_t(joint_id)] = v;
          }

          if (scale_it->second.scales.static_value) {
            uint64_t joint_id = joint_idMap.at(channels.first);
            if ((joint_id +1) > static_scales.size()) {
              static_scales.resize(size_t(joint_id+1));
            }
            value::half3 v;
            v[0] = value::float_to_half_full(scale_it->second.scales.static_value.value()[0]);
            v[1] = value::float_to_half_full(scale_it->second.scales.static_value.value()[1]);
            v[2] = value::float_to_half_full(scale_it->second.scales.static_value.value()[2]);
            static_scales[size_t(joint_id)] = v;
          }
        }
      }

      Animatable<std::vector<value::half3>> aval;
      if (static_scales.size() == joints.size()) {
        // Author static(default) value.
        aval.set_default(static_scales);
      }

      for (const auto &s : ts_scales) {
        aval.add_sample(s.first, s.second);
      } 

      dst->scales.set_value(aval);
    }
  }

  if (anim.blendshape_weights_map.size()) {
    StringAndIdMap target_idMap;
    for (const auto &target : anim.blendshape_weights_map)
    {
      uint64_t target_id = uint64_t(target_idMap.size());
      target_idMap.add(target.first, uint64_t(target_id));
    }

    std::vector<value::token> blendShapes(target_idMap.size());
    for (const auto &target : anim.blendshape_weights_map) {
      blendShapes[size_t(target_idMap.at(target.first))] = value::token(target.first);
    }
    dst->blendShapes = blendShapes;

    std::unordered_set<uint32_t> timeCodes;
    {
      const auto &weights_it = anim.blendshape_weights_map.cbegin();
      for (size_t t = 0; t < weights_it->second.samples.size(); t++) {
        timeCodes.insert(float_to_uint(weights_it->second.samples[t].t));
      }
    }

    std::map<double, std::vector<float>> ts_weights;
    for (const auto &tc : timeCodes) {
      ts_weights[float_to_double(uint_to_float(tc))].resize(blendShapes.size()); 
    }
    std::vector<float> static_weights;

    for (const auto &target : anim.blendshape_weights_map) {

      for (size_t t = 0; t < target.second.samples.size(); t++) {
        float tc = target.second.samples[t].t;
        if (!timeCodes.count(float_to_uint(tc))) {
          PUSH_ERROR_AND_RETURN(fmt::format("All blendshape weights should have same timeCodes. timeCode {} is only seen in `blendShapeWeights` animation channel of blendShape {}", tc, target.first));
        }
        uint64_t target_id = target_idMap.at(target.first);

        std::vector<float> &weights = ts_weights.at(float_to_double(tc));
        //DCOUT("weights.size " << weights.size() << ", target_id " << target_id);
        weights[size_t(target_id)] = target.second.samples[t].value;
      }

      if (target.second.static_value) {
        uint64_t target_id = target_idMap.at(target.first);
        if ((target_id +1) > static_weights.size()) {
          static_weights.resize(size_t(target_id+1));
        }
        static_weights[size_t(target_id)] = target.second.static_value.value(); 
      }
    }

    Animatable<std::vector<float>> aval;
    if (static_weights.size() == blendShapes.size()) {
      // Author static(default) value.
      aval.set_default(static_weights);
    }

    for (const auto &s : ts_weights) {
      aval.add_sample(s.first, s.second);
    } 

    dst->blendShapeWeights.set_value(aval);
  } else {
    // Just author 'blendShapeWeights' without value.
    dst->blendShapeWeights.set_value_empty();
  }

  dst->name = anim.prim_name;
  if (anim.display_name.size()) {
    dst->metas().displayName = anim.display_name;
  }
  return true;
}